

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> * __thiscall
capnp::RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::operator=
          (RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *this,
          RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *other)

{
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)other);
  AnyPointer::Pipeline::operator=
            (&(this->super_Pipeline)._typeless,&(other->super_Pipeline)._typeless);
  return this;
}

Assistant:

RemotePromise& operator=(RemotePromise&& other) = default;